

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

void __thiscall c4::yml::Tree::_check_next_flags(Tree *this,size_t node,type_bits f)

{
  NodeType_e NVar1;
  code *pcVar2;
  bool bVar3;
  size_t sVar4;
  char *pcVar5;
  
  if ((node == 0xffffffffffffffff) || (this->m_cap <= node)) {
    if ((s_error_flags & 1) != 0) {
      bVar3 = is_debugger_attached();
      if (bVar3) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
    }
    (*(code *)PTR_error_impl_002a27a8)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  NVar1 = this->m_buf[node].m_type.type;
  if ((f & 4) == 0) {
    if ((f & 8) == 0) goto LAB_0023ed55;
    if ((f & 1) != 0) {
      if ((s_error_flags & 1) != 0) {
        bVar3 = is_debugger_attached();
        if (bVar3) {
          pcVar2 = (code *)swi(3);
          (*pcVar2)();
          return;
        }
      }
      (*(code *)PTR_error_impl_002a27a8)
                ("cannot mark simultaneously as seq and val: check failed: (f & VAL) == 0",0x47,
                 (anonymous_namespace)::s_default_callbacks);
    }
    if ((NVar1 & MAP) != NOTYPE) {
      if ((s_error_flags & 1) != 0) {
        bVar3 = is_debugger_attached();
        if (bVar3) {
          pcVar2 = (code *)swi(3);
          (*pcVar2)();
          return;
        }
      }
      (*(code *)PTR_error_impl_002a27a8)
                ("cannot turn a map into a seq; clear first: check failed: (o & MAP) == 0",0x47,
                 (anonymous_namespace)::s_default_callbacks);
    }
    if ((NVar1 & VAL) == NOTYPE) goto LAB_0023ed55;
    if ((s_error_flags & 1) != 0) {
      bVar3 = is_debugger_attached();
      if (bVar3) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
    }
    pcVar5 = "cannot turn a val into a seq; clear first: check failed: (o & VAL) == 0";
  }
  else {
    if ((f & 8) != 0) {
      if ((s_error_flags & 1) != 0) {
        bVar3 = is_debugger_attached();
        if (bVar3) {
          pcVar2 = (code *)swi(3);
          (*pcVar2)();
          return;
        }
      }
      (*(code *)PTR_error_impl_002a27a8)
                ("cannot mark simultaneously as map and seq: check failed: (f & SEQ) == 0",0x47,
                 (anonymous_namespace)::s_default_callbacks);
    }
    if ((f & 1) != 0) {
      if ((s_error_flags & 1) != 0) {
        bVar3 = is_debugger_attached();
        if (bVar3) {
          pcVar2 = (code *)swi(3);
          (*pcVar2)();
          return;
        }
      }
      (*(code *)PTR_error_impl_002a27a8)
                ("cannot mark simultaneously as map and val: check failed: (f & VAL) == 0",0x47,
                 (anonymous_namespace)::s_default_callbacks);
    }
    if ((NVar1 & SEQ) != NOTYPE) {
      if ((s_error_flags & 1) != 0) {
        bVar3 = is_debugger_attached();
        if (bVar3) {
          pcVar2 = (code *)swi(3);
          (*pcVar2)();
          return;
        }
      }
      (*(code *)PTR_error_impl_002a27a8)
                ("cannot turn a seq into a map; clear first: check failed: (o & SEQ) == 0",0x47,
                 (anonymous_namespace)::s_default_callbacks);
    }
    if ((NVar1 & VAL) == NOTYPE) goto LAB_0023ed55;
    if ((s_error_flags & 1) != 0) {
      bVar3 = is_debugger_attached();
      if (bVar3) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
    }
    pcVar5 = "cannot turn a val into a map; clear first: check failed: (o & VAL) == 0";
  }
  (*(code *)PTR_error_impl_002a27a8)(pcVar5,0x47,(anonymous_namespace)::s_default_callbacks);
LAB_0023ed55:
  if ((f & 2) != 0) {
    bVar3 = is_root(this,node);
    if (bVar3) {
      if ((s_error_flags & 1) != 0) {
        bVar3 = is_debugger_attached();
        if (bVar3) {
          pcVar2 = (code *)swi(3);
          (*pcVar2)();
          return;
        }
      }
      (*(code *)PTR_error_impl_002a27a8)
                ("check failed: !is_root(node)",0x1c,(anonymous_namespace)::s_default_callbacks);
    }
    sVar4 = parent(this,node);
    if ((sVar4 == 0xffffffffffffffff) || (this->m_cap <= sVar4)) {
      if ((s_error_flags & 1) != 0) {
        bVar3 = is_debugger_attached();
        if (bVar3) {
          pcVar2 = (code *)swi(3);
          (*pcVar2)();
          return;
        }
      }
      (*(code *)PTR_error_impl_002a27a8)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    if ((this->m_buf[sVar4].m_type.type & MAP) == NOTYPE) {
      if ((s_error_flags & 1) != 0) {
        bVar3 = is_debugger_attached();
        if (bVar3) {
          pcVar2 = (code *)swi(3);
          (*pcVar2)();
          return;
        }
      }
      (*(code *)PTR_error_impl_002a27a8)
                ("check failed: is_map(pid)",0x19,(anonymous_namespace)::s_default_callbacks);
    }
  }
  if ((f & 1) != 0) {
    bVar3 = is_root(this,node);
    if (!bVar3) {
      sVar4 = parent(this,node);
      if ((sVar4 == 0xffffffffffffffff) || (this->m_cap <= sVar4)) {
        if ((s_error_flags & 1) != 0) {
          bVar3 = is_debugger_attached();
          if (bVar3) {
            pcVar2 = (code *)swi(3);
            (*pcVar2)();
            return;
          }
        }
        (*(code *)PTR_error_impl_002a27a8)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
      }
      if ((this->m_buf[sVar4].m_type.type & MAP) == NOTYPE) {
        if ((sVar4 == 0xffffffffffffffff) || (this->m_cap <= sVar4)) {
          if ((s_error_flags & 1) != 0) {
            bVar3 = is_debugger_attached();
            if (bVar3) {
              pcVar2 = (code *)swi(3);
              (*pcVar2)();
              return;
            }
          }
          (*(code *)PTR_error_impl_002a27a8)
                    ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                     (anonymous_namespace)::s_default_callbacks);
        }
        if ((this->m_buf[sVar4].m_type.type & SEQ) == NOTYPE) {
          if ((s_error_flags & 1) != 0) {
            bVar3 = is_debugger_attached();
            if (bVar3) {
              pcVar2 = (code *)swi(3);
              (*pcVar2)();
              return;
            }
          }
          (*(code *)PTR_error_impl_002a27a8)
                    ("check failed: is_map(pid) || is_seq(pid)",0x28,
                     (anonymous_namespace)::s_default_callbacks);
        }
      }
    }
  }
  return;
}

Assistant:

void _check_next_flags(size_t node, type_bits f)
    {
        auto n = _p(node);
        type_bits o = n->m_type; // old
        C4_UNUSED(o);
        if(f & MAP)
        {
            RYML_ASSERT_MSG((f & SEQ) == 0, "cannot mark simultaneously as map and seq");
            RYML_ASSERT_MSG((f & VAL) == 0, "cannot mark simultaneously as map and val");
            RYML_ASSERT_MSG((o & SEQ) == 0, "cannot turn a seq into a map; clear first");
            RYML_ASSERT_MSG((o & VAL) == 0, "cannot turn a val into a map; clear first");
        }
        else if(f & SEQ)
        {
            RYML_ASSERT_MSG((f & MAP) == 0, "cannot mark simultaneously as seq and map");
            RYML_ASSERT_MSG((f & VAL) == 0, "cannot mark simultaneously as seq and val");
            RYML_ASSERT_MSG((o & MAP) == 0, "cannot turn a map into a seq; clear first");
            RYML_ASSERT_MSG((o & VAL) == 0, "cannot turn a val into a seq; clear first");
        }
        if(f & KEY)
        {
            RYML_ASSERT(!is_root(node));
            auto pid = parent(node); C4_UNUSED(pid);
            RYML_ASSERT(is_map(pid));
        }
        if((f & VAL) && !is_root(node))
        {
            auto pid = parent(node); C4_UNUSED(pid);
            RYML_ASSERT(is_map(pid) || is_seq(pid));
        }
    }